

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O3

void cft1st(size_t n,float *a,float *w)

{
  float *pfVar1;
  ulong uVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  fVar4 = (float)*(undefined8 *)a;
  fVar5 = (float)((ulong)*(undefined8 *)a >> 0x20);
  fVar6 = (float)*(undefined8 *)(a + 2);
  fVar7 = (float)((ulong)*(undefined8 *)(a + 2) >> 0x20);
  fVar8 = fVar4 - fVar6;
  fVar9 = fVar5 - fVar7;
  fVar4 = fVar4 + fVar6;
  fVar5 = fVar5 + fVar7;
  fVar10 = a[6] + a[4];
  fVar11 = a[7] + a[5];
  fVar6 = a[4] - a[6];
  fVar7 = a[5] - a[7];
  *a = fVar4 + fVar10;
  a[1] = fVar5 + fVar11;
  a[2] = fVar8 - fVar7;
  a[3] = fVar9 + fVar6;
  a[4] = fVar4 - fVar10;
  a[5] = fVar5 - fVar11;
  a[6] = fVar8 + fVar7;
  a[7] = fVar9 - fVar6;
  fVar4 = w[2];
  fVar11 = (float)*(undefined8 *)(a + 8);
  fVar12 = (float)((ulong)*(undefined8 *)(a + 8) >> 0x20);
  fVar5 = (float)*(undefined8 *)(a + 10);
  fVar9 = fVar11 + fVar5;
  fVar6 = (float)((ulong)*(undefined8 *)(a + 10) >> 0x20);
  fVar10 = fVar12 + fVar6;
  fVar11 = fVar11 - fVar5;
  fVar12 = fVar12 - fVar6;
  fVar5 = (float)*(undefined8 *)(a + 0xc);
  fVar7 = (float)((ulong)*(undefined8 *)(a + 0xc) >> 0x20);
  fVar14 = (float)*(undefined8 *)(a + 0xe);
  fVar6 = fVar5 - fVar14;
  fVar15 = (float)((ulong)*(undefined8 *)(a + 0xe) >> 0x20);
  fVar8 = fVar7 - fVar15;
  fVar13 = fVar11 - fVar8;
  fVar8 = fVar8 + fVar11;
  fVar5 = fVar5 + fVar14;
  fVar7 = fVar7 + fVar15;
  *(ulong *)(a + 8) = CONCAT44(fVar10 + fVar7,fVar9 + fVar5);
  *(ulong *)(a + 0xc) = CONCAT44(fVar9 - fVar5,fVar7 - fVar10);
  fVar5 = fVar12 + fVar6;
  a[10] = (fVar13 - fVar5) * fVar4;
  a[0xb] = (fVar5 + fVar13) * fVar4;
  fVar6 = fVar6 - fVar12;
  a[0xe] = (fVar6 - fVar8) * fVar4;
  a[0xf] = (fVar6 + fVar8) * fVar4;
  if (0x10 < n) {
    uVar2 = 0x10;
    lVar3 = 0xc;
    do {
      fVar4 = *(float *)((long)w + lVar3 + -4);
      fVar5 = *(float *)((long)w + lVar3);
      fVar6 = *(float *)((long)w + uVar2);
      fVar7 = *(float *)((long)w + uVar2 + 4);
      fVar8 = -fVar5;
      fVar9 = fVar6 - (fVar5 + fVar5) * fVar7;
      fVar10 = (fVar5 + fVar5) * fVar6 - fVar7;
      fVar11 = (float)*(undefined8 *)(a + uVar2);
      fVar12 = (float)((ulong)*(undefined8 *)(a + uVar2) >> 0x20);
      fVar17 = (float)*(undefined8 *)(a + uVar2 + 2);
      fVar21 = fVar11 + fVar17;
      fVar18 = (float)((ulong)*(undefined8 *)(a + uVar2 + 2) >> 0x20);
      fVar22 = fVar12 + fVar18;
      fVar14 = (float)*(undefined8 *)(a + uVar2 + 4);
      fVar15 = (float)((ulong)*(undefined8 *)(a + uVar2 + 4) >> 0x20);
      fVar19 = (float)*(undefined8 *)(a + uVar2 + 6);
      fVar13 = fVar14 + fVar19;
      fVar20 = (float)((ulong)*(undefined8 *)(a + uVar2 + 6) >> 0x20);
      fVar16 = fVar15 + fVar20;
      fVar11 = fVar11 - fVar17;
      fVar12 = fVar12 - fVar18;
      *(ulong *)(a + uVar2) = CONCAT44(fVar22 + fVar16,fVar21 + fVar13);
      fVar14 = fVar14 - fVar19;
      fVar15 = fVar15 - fVar20;
      fVar17 = fVar11 + fVar15;
      fVar18 = fVar12 + fVar14;
      fVar12 = fVar12 - fVar14;
      fVar11 = fVar11 - fVar15;
      fVar21 = fVar21 - fVar13;
      fVar22 = fVar22 - fVar16;
      pfVar1 = a + uVar2 + 2;
      *pfVar1 = fVar18 * -fVar7 + fVar11 * fVar6;
      pfVar1[1] = fVar11 * fVar7 + fVar18 * fVar6;
      pfVar1[2] = fVar22 * fVar8 + fVar21 * fVar4;
      pfVar1[3] = fVar21 * fVar5 + fVar22 * fVar4;
      *(ulong *)(a + uVar2 + 6) =
           CONCAT44(fVar9 * fVar12 + fVar10 * fVar17,fVar9 * fVar17 + -fVar10 * fVar12);
      fVar5 = *(float *)((long)w + uVar2 + 8);
      fVar6 = *(float *)((long)w + uVar2 + 0xc);
      fVar7 = fVar5 - (fVar4 + fVar4) * fVar6;
      fVar9 = (fVar4 + fVar4) * fVar5 - fVar6;
      fVar10 = (float)*(undefined8 *)(a + uVar2 + 8);
      fVar11 = (float)((ulong)*(undefined8 *)(a + uVar2 + 8) >> 0x20);
      fVar12 = (float)*(undefined8 *)(a + uVar2 + 10);
      fVar18 = fVar10 + fVar12;
      fVar14 = (float)((ulong)*(undefined8 *)(a + uVar2 + 10) >> 0x20);
      fVar21 = fVar11 + fVar14;
      fVar15 = (float)*(undefined8 *)(a + uVar2 + 0xc);
      fVar13 = (float)((ulong)*(undefined8 *)(a + uVar2 + 0xc) >> 0x20);
      fVar22 = (float)*(undefined8 *)(a + uVar2 + 0xe);
      fVar16 = fVar15 + fVar22;
      fVar19 = (float)((ulong)*(undefined8 *)(a + uVar2 + 0xe) >> 0x20);
      fVar17 = fVar13 + fVar19;
      fVar10 = fVar10 - fVar12;
      fVar11 = fVar11 - fVar14;
      *(ulong *)(a + uVar2 + 8) = CONCAT44(fVar21 + fVar17,fVar18 + fVar16);
      fVar15 = fVar15 - fVar22;
      fVar13 = fVar13 - fVar19;
      fVar12 = fVar10 + fVar13;
      fVar14 = fVar11 + fVar15;
      fVar11 = fVar11 - fVar15;
      fVar10 = fVar10 - fVar13;
      fVar18 = fVar18 - fVar16;
      fVar21 = fVar21 - fVar17;
      pfVar1 = a + uVar2 + 10;
      *pfVar1 = fVar14 * -fVar6 + fVar10 * fVar5;
      pfVar1[1] = fVar10 * fVar6 + fVar14 * fVar5;
      pfVar1[2] = fVar21 * -fVar4 + fVar18 * fVar8;
      pfVar1[3] = fVar18 * fVar4 + fVar21 * fVar8;
      *(ulong *)(a + uVar2 + 0xe) =
           CONCAT44(fVar7 * fVar11 + fVar9 * fVar12,fVar7 * fVar12 + -fVar9 * fVar11);
      uVar2 = uVar2 + 0x10;
      lVar3 = lVar3 + 8;
    } while (uVar2 < n);
  }
  return;
}

Assistant:

static void cft1st(size_t n, float *a, float *w)
{
    size_t j, k1, k2;
    float wk1r, wk1i, wk2r, wk2i, wk3r, wk3i;
    float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

    x0r = a[0] + a[2];
    x0i = a[1] + a[3];
    x1r = a[0] - a[2];
    x1i = a[1] - a[3];
    x2r = a[4] + a[6];
    x2i = a[5] + a[7];
    x3r = a[4] - a[6];
    x3i = a[5] - a[7];
    a[0] = x0r + x2r;
    a[1] = x0i + x2i;
    a[4] = x0r - x2r;
    a[5] = x0i - x2i;
    a[2] = x1r - x3i;
    a[3] = x1i + x3r;
    a[6] = x1r + x3i;
    a[7] = x1i - x3r;
    wk1r = w[2];
    x0r = a[8] + a[10];
    x0i = a[9] + a[11];
    x1r = a[8] - a[10];
    x1i = a[9] - a[11];
    x2r = a[12] + a[14];
    x2i = a[13] + a[15];
    x3r = a[12] - a[14];
    x3i = a[13] - a[15];
    a[8] = x0r + x2r;
    a[9] = x0i + x2i;
    a[12] = x2i - x0i;
    a[13] = x0r - x2r;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[10] = wk1r * (x0r - x0i);
    a[11] = wk1r * (x0r + x0i);
    x0r = x3i + x1r;
    x0i = x3r - x1i;
    a[14] = wk1r * (x0i - x0r);
    a[15] = wk1r * (x0i + x0r);
    k1 = 0;
    for (j = 16; j < n; j += 16) {
        k1 += 2;
        k2 = 2 * k1;
        wk2r = w[k1];
        wk2i = w[k1 + 1];
        wk1r = w[k2];
        wk1i = w[k2 + 1];
        wk3r = wk1r - 2 * wk2i * wk1i;
        wk3i = 2 * wk2i * wk1r - wk1i;
        x0r = a[j] + a[j + 2];
        x0i = a[j + 1] + a[j + 3];
        x1r = a[j] - a[j + 2];
        x1i = a[j + 1] - a[j + 3];
        x2r = a[j + 4] + a[j + 6];
        x2i = a[j + 5] + a[j + 7];
        x3r = a[j + 4] - a[j + 6];
        x3i = a[j + 5] - a[j + 7];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        x0r -= x2r;
        x0i -= x2i;
        a[j + 4] = wk2r * x0r - wk2i * x0i;
        a[j + 5] = wk2r * x0i + wk2i * x0r;
        x0r = x1r - x3i;
        x0i = x1i + x3r;
        a[j + 2] = wk1r * x0r - wk1i * x0i;
        a[j + 3] = wk1r * x0i + wk1i * x0r;
        x0r = x1r + x3i;
        x0i = x1i - x3r;
        a[j + 6] = wk3r * x0r - wk3i * x0i;
        a[j + 7] = wk3r * x0i + wk3i * x0r;
        wk1r = w[k2 + 2];
        wk1i = w[k2 + 3];
        wk3r = wk1r - 2 * wk2r * wk1i;
        wk3i = 2 * wk2r * wk1r - wk1i;
        x0r = a[j + 8] + a[j + 10];
        x0i = a[j + 9] + a[j + 11];
        x1r = a[j + 8] - a[j + 10];
        x1i = a[j + 9] - a[j + 11];
        x2r = a[j + 12] + a[j + 14];
        x2i = a[j + 13] + a[j + 15];
        x3r = a[j + 12] - a[j + 14];
        x3i = a[j + 13] - a[j + 15];
        a[j + 8] = x0r + x2r;
        a[j + 9] = x0i + x2i;
        x0r -= x2r;
        x0i -= x2i;
        a[j + 12] = -wk2i * x0r - wk2r * x0i;
        a[j + 13] = -wk2i * x0i + wk2r * x0r;
        x0r = x1r - x3i;
        x0i = x1i + x3r;
        a[j + 10] = wk1r * x0r - wk1i * x0i;
        a[j + 11] = wk1r * x0i + wk1i * x0r;
        x0r = x1r + x3i;
        x0i = x1i - x3r;
        a[j + 14] = wk3r * x0r - wk3i * x0i;
        a[j + 15] = wk3r * x0i + wk3i * x0r;
    }
}